

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

void __thiscall aiNode::addChildren(aiNode *this,uint numChildren,aiNode **children)

{
  uint i;
  ulong uVar1;
  void *__dest;
  aiNode **ppaVar2;
  uint uVar3;
  ulong uVar4;
  size_t local_40;
  
  if (numChildren != 0 && children != (aiNode **)0x0) {
    uVar4 = (ulong)numChildren;
    uVar1 = 0;
    do {
      if (children[uVar1] != (aiNode *)0x0) {
        children[uVar1]->mParent = this;
      }
      uVar1 = uVar1 + 1;
    } while (uVar4 != uVar1);
    uVar1 = (ulong)this->mNumChildren;
    if (uVar1 != 0) {
      local_40 = uVar1 * 8;
      __dest = operator_new__(local_40);
      ppaVar2 = this->mChildren;
      memcpy(__dest,ppaVar2,local_40);
      if (ppaVar2 != (aiNode **)0x0) {
        operator_delete__(ppaVar2);
        uVar1 = (ulong)this->mNumChildren;
        local_40 = uVar1 * 8;
      }
      uVar3 = (int)uVar1 + numChildren;
      ppaVar2 = (aiNode **)operator_new__((ulong)uVar3 * 8);
      this->mChildren = ppaVar2;
      memcpy(ppaVar2,__dest,local_40);
      memcpy(ppaVar2 + uVar1,children,uVar4 << 3);
      this->mNumChildren = uVar3;
      operator_delete__(__dest);
      return;
    }
    ppaVar2 = (aiNode **)operator_new__(uVar4 * 8);
    this->mChildren = ppaVar2;
    uVar1 = 0;
    do {
      this->mChildren[uVar1] = children[uVar1];
      uVar1 = uVar1 + 1;
    } while (uVar4 != uVar1);
    this->mNumChildren = numChildren;
  }
  return;
}

Assistant:

void aiNode::addChildren(unsigned int numChildren, aiNode **children) {
    if (nullptr == children || 0 == numChildren) {
        return;
    }

    for (unsigned int i = 0; i < numChildren; i++) {
        aiNode *child = children[i];
        if (nullptr != child) {
            child->mParent = this;
        }
    }

    if (mNumChildren > 0) {
        aiNode **tmp = new aiNode*[mNumChildren];
        ::memcpy(tmp, mChildren, sizeof(aiNode*) * mNumChildren);
        delete[] mChildren;
        mChildren = new aiNode*[mNumChildren + numChildren];
        ::memcpy(mChildren, tmp, sizeof(aiNode*) * mNumChildren);
        ::memcpy(&mChildren[mNumChildren], children, sizeof(aiNode*)* numChildren);
        mNumChildren += numChildren;
        delete[] tmp;
    }
    else {
        mChildren = new aiNode*[numChildren];
        for (unsigned int i = 0; i < numChildren; i++) {
            mChildren[i] = children[i];
        }
        mNumChildren = numChildren;
    }
}